

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  size_t __n;
  int vert_end_idx;
  ImDrawList *this;
  ImVec2 IVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar5;
  undefined1 auVar6 [16];
  ImVec2 *out_r;
  undefined4 col_00;
  uint uVar7;
  ImU32 col_upr_right;
  ImU32 IVar8;
  int iVar9;
  undefined7 uVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  char *text_end;
  void *pvVar10;
  undefined7 extraout_var;
  byte bVar12;
  ImU32 col_bot_right;
  int iVar13;
  char cVar14;
  ImVec2 *pIVar15;
  long lVar16;
  uint uVar17;
  ImGuiContext *g;
  bool bVar18;
  uint uVar19;
  float fVar20;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar21;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  float fVar22;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar23;
  undefined4 extraout_XMM0_Dd_01;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max_01;
  ImVec2 p_max_02;
  ImVec2 half_sz;
  ImVec2 gradient_p1;
  ImVec2 half_sz_00;
  float fVar24;
  float S;
  float V;
  ImVec2 picker_pos;
  ImVec2 wheel_center;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  ImU32 col_hues [7];
  float vv;
  ImVec2 sv_cursor_pos;
  ImVec2 tra;
  ImVec4 hue_color_f;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_228;
  uint local_224;
  float local_220;
  float local_21c;
  ImGuiContext *local_218;
  uint local_210;
  uint local_20c;
  ImVec2 local_208;
  float local_200;
  float local_1fc;
  undefined1 local_1f8 [8];
  undefined8 uStack_1f0;
  ImVec2 local_1e8;
  ImVec2 *local_1e0;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [8];
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  ImU32 local_19c;
  ImU32 local_198;
  uint local_194;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  float local_170;
  float local_16c;
  int local_168;
  int local_164;
  float local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [12];
  float fStack_13c;
  float local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  ImVec2 local_128;
  float fStack_120;
  float fStack_11c;
  undefined4 uStack_118;
  uint uStack_114;
  ImVec2 local_110;
  undefined1 local_108 [16];
  ImGuiWindow *local_f0;
  ImVec2 local_e8;
  ImU32 local_dc;
  undefined1 local_d8 [16];
  ImVec4 local_c8;
  undefined1 local_b8 [16];
  float local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  size_t local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_f0 = GImGui->CurrentWindow;
  local_f0->WriteAccessed = true;
  if (local_f0->SkipItems != false) {
    bVar12 = 0;
    goto LAB_00350902;
  }
  this = local_f0->DrawList;
  local_128 = (ImVec2)ref_col;
  local_1f8._0_4_ = CalcItemWidth();
  local_1f8._4_4_ = extraout_XMM0_Db;
  uStack_1f0._0_4_ = extraout_XMM0_Dc;
  uStack_1f0._4_4_ = extraout_XMM0_Dd;
  local_218 = pIVar5;
  (pIVar5->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar17 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar17);
  }
  pIVar5 = local_218;
  if ((flags & 0x6000000U) == 0) {
    uVar7 = local_218->ColorEditOptions & 0x6000000;
    uVar19 = 0x2000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar17 = uVar17 | uVar19;
  }
  if ((uVar17 & 0x18000000) == 0) {
    uVar7 = local_218->ColorEditOptions & 0x18000000;
    uVar19 = 0x8000000;
    if (uVar7 != 0) {
      uVar19 = uVar7;
    }
    uVar17 = uVar17 | uVar19;
  }
  uVar19 = (uVar17 & 0x6000000) - 1;
  if ((uVar17 & 0x6000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1183,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar19 = (uVar17 & 0x18000000) - 1;
  if ((uVar17 & 0x18000000 ^ uVar19) <= uVar19) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui_widgets.cpp"
                  ,0x1184,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar17 & 8) == 0) {
    uVar17 = uVar17 | local_218->ColorEditOptions & 0x10000U;
  }
  local_194 = uVar17 & 0x10002;
  bVar18 = local_194 == 0x10000;
  local_208 = (local_f0->DC).CursorPos;
  local_1e0 = (ImVec2 *)col;
  local_138 = GetFrameHeight();
  pIVar15 = local_1e0;
  fVar20 = (pIVar5->Style).ItemInnerSpacing.x;
  local_108 = ZEXT416((uint)fVar20);
  fVar24 = (float)local_1f8._0_4_ - (local_138 + fVar20) * (float)(byte)(bVar18 + 1);
  uVar19 = -(uint)(fVar24 <= local_138);
  uStack_1b4 = local_1f8._4_4_ & extraout_XMM0_Db_00;
  uStack_1b0 = (uint)uStack_1f0 & extraout_XMM0_Dc_00;
  uStack_1ac = uStack_1f0._4_4_ & extraout_XMM0_Dd_00;
  local_1b8 = (float)(uVar19 & (uint)local_138 | ~uVar19 & (uint)fVar24);
  local_1f8._0_4_ = local_208.x;
  _local_1c8 = ZEXT416((uint)(local_208.x + local_1b8 + fVar20));
  __n = (ulong)((uVar17 & 2) == 0) * 4 + 0xc;
  uStack_134 = extraout_XMM0_Db_00;
  uStack_130 = extraout_XMM0_Dc_00;
  uStack_12c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_1e0,__n);
  local_200 = local_1b8 * 0.08;
  local_a8 = local_1b8 * 0.5;
  local_1e8.x = (local_138 + local_1b8) * 0.5 + (float)local_1f8._0_4_;
  uStack_a4 = uStack_1b4;
  uStack_a0 = uStack_1b0;
  uStack_9c = uStack_1ac;
  local_1e8.y = local_208.y + local_a8;
  local_1f8._4_4_ = uStack_1b4;
  local_1f8._0_4_ = local_a8 - local_200;
  uStack_1f0._0_4_ = uStack_1b0;
  uStack_1f0._4_4_ = uStack_1ac;
  local_180.x = (local_a8 - local_200) - (float)(int)(local_1b8 * 0.027);
  local_180.y = 0.0;
  local_190.x = local_180.x * -0.5;
  local_188.y = local_180.x * -0.866025;
  local_190.y = local_180.x * 0.866025;
  local_228 = pIVar15->x;
  local_220 = pIVar15->y;
  local_21c = pIVar15[1].x;
  local_1d4 = local_21c;
  local_1d0 = local_220;
  local_1cc = local_228;
  local_188.x = local_190.x;
  if ((uVar17 >> 0x1b & 1) == 0) {
    if ((uVar17 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_228,local_220,local_21c,&local_1cc,&local_1d0,&local_1d4);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_228,local_220,local_21c,&local_228,&local_220,&local_21c);
    if (((local_220 == 0.0) && (!NAN(local_220))) &&
       (IVar21.x = local_218->ColorEditLastColor[0], IVar21.y = local_218->ColorEditLastColor[1],
       local_218->ColorEditLastColor[2] == pIVar15[1].x && IVar21 == *pIVar15)) {
      local_228 = local_218->ColorEditLastHue;
    }
  }
  local_158._4_4_ = uStack_134;
  local_158._0_4_ = local_138 + (float)local_1c8._0_4_;
  local_158._8_4_ = uStack_130;
  local_158._12_4_ = uStack_12c;
  PushItemFlag(8,true);
  pIVar5 = local_218;
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) == 0) {
      local_20c = 0;
      local_210 = 0;
      local_224 = 0;
    }
    else {
      local_178.y = local_1b8;
      local_178.x = local_1b8;
      InvisibleButton("sv",&local_178);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar20 = ((local_218->IO).MousePos.x - local_208.x) / (local_1b8 + -1.0);
        local_220 = 1.0;
        if (fVar20 <= 1.0) {
          local_220 = fVar20;
        }
        local_220 = (float)(~-(uint)(fVar20 < 0.0) & (uint)local_220);
        fVar24 = ((local_218->IO).MousePos.y - local_208.y) / (local_1b8 + -1.0);
        fVar20 = 1.0;
        if (fVar24 <= 1.0) {
          fVar20 = fVar24;
        }
        local_21c = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar20));
        local_20c = (uint)CONCAT71((int7)((ulong)local_218 >> 8),1);
      }
      else {
        local_20c = 0;
      }
      if ((uVar17 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_178.y = local_208.y;
      local_178.x = (float)local_1c8._0_4_;
      SetCursorScreenPos(&local_178);
      local_178.y = local_1b8;
      local_178.x = local_138;
      InvisibleButton("hue",&local_178);
      bVar18 = IsItemActive();
      if (bVar18) {
        fVar20 = ((local_218->IO).MousePos.y - local_208.y) / (local_1b8 + -1.0);
        local_228 = 1.0;
        if (fVar20 <= 1.0) {
          local_228 = fVar20;
        }
        local_228 = (float)(~-(uint)(fVar20 < 0.0) & (uint)local_228);
        uVar11 = (undefined7)((ulong)local_218 >> 8);
        local_210 = (uint)CONCAT71(uVar11,1);
        local_224 = (uint)CONCAT71(uVar11,1);
      }
      else {
        local_210 = 0;
        local_224 = local_20c;
      }
    }
  }
  else {
    local_178.y = local_1b8;
    local_178.x = (local_218->Style).ItemInnerSpacing.x + local_1b8 + local_138;
    InvisibleButton("hsv",&local_178);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar24 = (pIVar5->IO).MouseClickedPos[0].x - local_1e8.x;
      local_d8 = ZEXT416((uint)fVar24);
      fVar22 = (pIVar5->IO).MouseClickedPos[0].y - local_1e8.y;
      fVar20 = (pIVar5->IO).MousePos.x - local_1e8.x;
      local_88 = ZEXT416((uint)fVar20);
      local_98 = (pIVar5->IO).MousePos.y - local_1e8.y;
      fVar24 = fVar24 * fVar24 + fVar22 * fVar22;
      local_b8._0_4_ = fVar22;
      if ((fVar24 < ((float)local_1f8._0_4_ + -1.0) * ((float)local_1f8._0_4_ + -1.0)) ||
         ((local_a8 + 1.0) * (local_a8 + 1.0) < fVar24)) {
        local_210 = 0;
      }
      else {
        fVar20 = atan2f(local_98,fVar20);
        fVar20 = (fVar20 / 3.1415927) * 0.5;
        local_228 = (float)(~-(uint)(fVar20 < 0.0) & (uint)fVar20 |
                           (uint)(fVar20 + 1.0) & -(uint)(fVar20 < 0.0));
        local_210 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_1fc = cosf(local_228 * -2.0 * 3.1415927);
      fVar20 = sinf(local_228 * -2.0 * 3.1415927);
      local_178.x = (float)local_d8._0_4_ * local_1fc - fVar20 * (float)local_b8._0_4_;
      fVar24 = (float)local_b8._0_4_ * local_1fc;
      local_b8._0_4_ = fVar20;
      local_178.y = (float)local_d8._0_4_ * fVar20 + fVar24;
      bVar18 = ImTriangleContainsPoint(&local_180,&local_188,&local_190,&local_178);
      if (bVar18) {
        local_178.x = (float)local_88._0_4_ * local_1fc - (float)local_b8._0_4_ * local_98;
        local_178.y = (float)local_88._0_4_ * (float)local_b8._0_4_ + local_98 * local_1fc;
        bVar18 = ImTriangleContainsPoint(&local_180,&local_188,&local_190,&local_178);
        if (!bVar18) {
          local_178 = ImTriangleClosestPoint(&local_180,&local_188,&local_190,&local_178);
        }
        ImTriangleBarycentricCoords
                  (&local_180,&local_188,&local_190,&local_178,&local_c8.x,(float *)local_148,
                   &local_110.x);
        fVar24 = 1.0 - (float)local_148._0_4_;
        fVar20 = 1.0;
        if (fVar24 <= 1.0) {
          fVar20 = fVar24;
        }
        local_21c = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar24 < 0.0001) & (uint)fVar20);
        fVar24 = local_c8.x / local_21c;
        fVar20 = 1.0;
        if (fVar24 <= 1.0) {
          fVar20 = fVar24;
        }
        local_220 = (float)(-(uint)(fVar24 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar24 < 0.0001) & (uint)fVar20);
        uVar11 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_20c = (uint)CONCAT71(uVar11,1);
        local_224 = (uint)CONCAT71(uVar11,1);
        pIVar15 = local_1e0;
      }
      else {
        local_20c = 0;
        local_224 = local_210;
      }
    }
    else {
      local_20c = 0;
      local_210 = 0;
      local_224 = 0;
    }
    if ((uVar17 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_108._0_4_ = (float)local_108._0_4_ + (float)local_158._0_4_;
  if (local_194 == 0x10000) {
    local_178.y = local_208.y;
    local_178.x = (float)local_108._0_4_;
    SetCursorScreenPos(&local_178);
    local_178.y = local_1b8;
    local_178.x = local_138;
    InvisibleButton("alpha",&local_178);
    bVar18 = IsItemActive();
    if (bVar18) {
      fVar24 = ((local_218->IO).MousePos.y - local_208.y) / (local_1b8 + -1.0);
      fVar20 = 1.0;
      if (fVar24 <= 1.0) {
        fVar20 = fVar24;
      }
      pIVar15[1].y = (float)(-(uint)(fVar24 < 0.0) & 0x3f800000 |
                            ~-(uint)(fVar24 < 0.0) & (uint)(1.0 - fVar20));
      local_224 = (uint)CONCAT71((int7)((ulong)local_218 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar17 >> 8 & 1) == 0) {
    SameLine(0.0,(local_218->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar17) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar17 >> 8 & 1) != 0) {
      SameLine(0.0,(local_218->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  local_70 = __n;
  if ((uVar17 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    IVar21 = local_128;
    local_178 = *pIVar15;
    local_170 = pIVar15[1].x;
    if ((uVar17 & 2) == 0) {
      local_16c = pIVar15[1].y;
    }
    else {
      local_16c = 1.0;
    }
    if ((char)uVar17 < '\0') {
      Text("Current");
    }
    local_128.x = local_138 * 3.0;
    local_128.y = local_138 + local_138;
    uStack_118 = 0;
    uStack_114 = uStack_134;
    ColorButton("##current",(ImVec4 *)&local_178,uVar17 & 0x180e0040,local_128);
    if (IVar21 != (ImVec2)0x0) {
      Text("Original");
      local_c8._0_8_ = *(undefined8 *)IVar21;
      local_c8.z = *(float *)((long)IVar21 + 8);
      if ((uVar17 & 2) == 0) {
        local_c8.w = *(float *)((long)IVar21 + 0xc);
      }
      else {
        local_c8.w = 1.0;
      }
      bVar18 = ColorButton("##original",&local_c8,uVar17 & 0x180e0040,local_128);
      if (bVar18) {
        pvVar10 = memcpy(pIVar15,(void *)IVar21,__n);
        local_224 = (uint)CONCAT71((int7)((ulong)pvVar10 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  if (((char)local_210 != '\0') || ((char)local_20c != '\0')) {
    if ((uVar17 >> 0x1b & 1) == 0) {
      if ((uVar17 >> 0x1c & 1) != 0) {
        pIVar15->x = local_228;
        pIVar15->y = local_220;
        pIVar15[1].x = local_21c;
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_228) & (uint)local_228 |
                        (uint)(local_228 + -1e-05) & -(uint)(1.0 <= local_228)),
                 (float)(~-(uint)(0.0 < local_220) & 0x3727c5ac |
                        (uint)local_220 & -(uint)(0.0 < local_220)),
                 (float)(~-(uint)(0.0 < local_21c) & 0x358637bd |
                        (uint)local_21c & -(uint)(0.0 < local_21c)),&pIVar15->x,&pIVar15->y,
                 &pIVar15[1].x);
      local_218->ColorEditLastHue = local_228;
      fVar20 = pIVar15->y;
      local_218->ColorEditLastColor[0] = pIVar15->x;
      local_218->ColorEditLastColor[1] = fVar20;
      local_218->ColorEditLastColor[2] = pIVar15[1].x;
    }
  }
  cVar14 = '\x01';
  fVar20 = local_138 * 0.2;
  fVar24 = 0.0;
  fVar22 = 0.0;
  fVar23 = 0.0;
  if ((uVar17 & 0x20) == 0) {
    local_128.y = 0.0;
    local_128.x = local_138 * 0.2;
    fStack_120 = 0.0;
    fStack_11c = 0.0;
    fVar20 = (float)local_108._0_4_;
    if (local_194 != 0x10000) {
      fVar20 = (float)local_1c8._0_4_;
    }
    PushItemWidth((fVar20 + local_138) - local_208.x);
    uVar19 = uVar17 & 0x198e001a;
    cVar14 = '\x01';
    if (((uVar17 >> 0x14 & 1) != 0 || (uVar17 & 0x600000) == 0) &&
       (bVar18 = ColorEdit4("##rgb",&local_1e0->x,uVar19 | 0x100004), bVar18)) {
      local_224 = (uint)CONCAT71(extraout_var,1);
      if (local_218->ActiveId == 0) {
        cVar14 = '\x01';
      }
      else {
        cVar14 = local_218->ActiveIdAllowOverlap;
      }
    }
    if ((uVar17 >> 0x15 & 1) != 0 || (uVar17 & 0x500000) == 0) {
      bVar18 = ColorEdit4("##hsv",&local_1e0->x,uVar19 | 0x200004);
      local_224 = CONCAT31((int3)(local_224 >> 8),(byte)local_224 | bVar18);
    }
    if ((uVar17 >> 0x16 & 1) != 0 || (uVar17 & 0x300000) == 0) {
      bVar18 = ColorEdit4("##hex",&local_1e0->x,uVar19 | 0x400004);
      local_224 = CONCAT31((int3)(local_224 >> 8),(byte)local_224 | bVar18);
    }
    PopItemWidth();
    fVar20 = local_128.x;
    fVar24 = local_128.y;
    fVar22 = fStack_120;
    fVar23 = fStack_11c;
  }
  out_r = local_1e0;
  fVar20 = (float)(int)fVar20;
  fVar24 = (float)(int)fVar24;
  fVar22 = (float)(int)fVar22;
  fVar23 = (float)(int)fVar23;
  if (((uVar17 >> 0x1b & 1) != 0) && (cVar14 == '\0')) {
    local_128.y = fVar24;
    local_128.x = fVar20;
    fStack_120 = fVar22;
    fStack_11c = fVar23;
    ColorConvertRGBtoHSV
              (local_1e0->x,local_1e0->y,local_1e0[1].x,&local_178.x,&local_c8.x,(float *)local_148)
    ;
    if ((local_178.x <= 0.0) && (0.0 < local_228)) {
      if (0.0 < (float)local_148._0_4_) {
LAB_0034fab7:
        if (0.0 < local_c8.x) goto LAB_0034fadd;
        fVar20 = local_220 * 0.5;
      }
      else {
        if ((local_21c == (float)local_148._0_4_) &&
           (!NAN(local_21c) && !NAN((float)local_148._0_4_))) goto LAB_0034fab7;
        local_148._0_4_ = local_21c * 0.5;
        fVar20 = local_220;
      }
      ColorConvertHSVtoRGB
                (local_228,fVar20,(float)local_148._0_4_,&out_r->x,&pIVar15->y,&pIVar15[1].x);
    }
LAB_0034fadd:
    fVar20 = local_128.x;
    fVar24 = local_128.y;
    fVar22 = fStack_120;
    fVar23 = fStack_11c;
  }
  pIVar15 = local_1e0;
  local_68 = (float)(int)fVar20;
  fStack_64 = (float)(int)fVar24;
  fStack_60 = (float)(int)fVar22;
  fStack_5c = (float)(int)fVar23;
  if ((char)local_224 != '\0') {
    if ((uVar17 >> 0x1b & 1) == 0) {
      if ((uVar17 >> 0x1c & 1) != 0) {
        local_228 = local_1e0->x;
        local_220 = local_1e0->y;
        local_21c = local_1e0[1].x;
        ColorConvertHSVtoRGB(local_228,local_220,local_21c,&local_1cc,&local_1d0,&local_1d4);
      }
    }
    else {
      local_1cc = local_1e0->x;
      local_1d0 = local_1e0->y;
      local_1d4 = local_1e0[1].x;
      ColorConvertRGBtoHSV(local_1cc,local_1d0,local_1d4,&local_228,&local_220,&local_21c);
      if (((local_220 == 0.0) && (!NAN(local_220))) &&
         (IVar2.x = local_218->ColorEditLastColor[0], IVar2.y = local_218->ColorEditLastColor[1],
         local_218->ColorEditLastColor[2] == pIVar15[1].x && IVar2 == *pIVar15)) {
        local_228 = local_218->ColorEditLastHue;
      }
    }
  }
  pIVar5 = local_218;
  local_c8.w = (local_218->Style).Alpha;
  fVar20 = 1.0;
  if (local_c8.w <= 1.0) {
    fVar20 = local_c8.w;
  }
  local_c8.x = 1.0;
  local_c8.y = 1.0;
  local_c8.z = 1.0;
  col_bot_right =
       (int)((float)(~-(uint)(local_c8.w < 0.0) & (uint)fVar20) * 255.0 + 0.5) * 0x1000000;
  local_168 = col_bot_right + 0xff0000;
  local_16c = (float)(col_bot_right + 0xffff00);
  local_d8._0_4_ = col_bot_right + 0xffffff;
  local_160 = (float)(col_bot_right + 0xff);
  local_178.y = (float)(col_bot_right + 0xffff);
  local_178.x = local_160;
  local_170 = (float)(col_bot_right + 0xff00);
  local_198 = col_bot_right + 0x808080;
  local_164 = col_bot_right + 0xff00ff;
  ColorConvertHSVtoRGB(local_228,1.0,1.0,&local_c8.x,&local_c8.y,&local_c8.z);
  col_upr_right = ColorConvertFloat4ToU32(&local_c8);
  fStack_13c = (pIVar5->Style).Alpha;
  local_148._4_4_ = local_1d0;
  local_148._0_4_ = local_1cc;
  local_148._8_4_ = local_1d4;
  IVar8 = ColorConvertFloat4ToU32((ImVec4 *)local_148);
  local_110.x = 0.0;
  local_110.y = 0.0;
  if ((uVar17 >> 0x1a & 1) == 0) {
    if ((uVar17 >> 0x19 & 1) != 0) {
      local_148._0_4_ = local_208.x + local_1b8;
      local_148._4_4_ = local_208.y + local_1b8;
      local_19c = IVar8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_208,(ImVec2 *)local_148,local_d8._0_4_,col_upr_right,col_upr_right,
                 local_d8._0_4_);
      local_148._0_4_ = local_208.x + local_1b8;
      local_148._4_4_ = local_208.y + local_1b8;
      ImDrawList::AddRectFilledMultiColor
                (this,&local_208,(ImVec2 *)local_148,0,0,col_bot_right,col_bot_right);
      p_max_01.x = local_208.x + local_1b8;
      p_max_01.y = local_208.y + local_1b8;
      RenderFrameBorder(local_208,p_max_01,0.0);
      fVar20 = 1.0;
      if (local_220 <= 1.0) {
        fVar20 = local_220;
      }
      fVar24 = (float)(int)((float)(~-(uint)(local_220 < 0.0) & (uint)fVar20) * local_1b8 +
                            local_208.x + 0.5);
      fVar20 = local_1b8 + local_208.x + -2.0;
      if (fVar24 <= fVar20) {
        fVar20 = fVar24;
      }
      uVar17 = -(uint)(fVar24 < local_208.x + 2.0);
      fVar22 = 1.0 - local_21c;
      fVar24 = 1.0;
      if (fVar22 <= 1.0) {
        fVar24 = fVar22;
      }
      fVar22 = (float)(int)((float)(~-(uint)(fVar22 < 0.0) & (uint)fVar24) * local_1b8 + local_208.y
                           + 0.5);
      fVar24 = local_208.y + local_1b8 + -2.0;
      if (fVar22 <= fVar24) {
        fVar24 = fVar22;
      }
      uVar19 = -(uint)(fVar22 < local_208.y + 2.0);
      local_110.y = (float)(uVar19 & (uint)(local_208.y + 2.0) | ~uVar19 & (uint)fVar24);
      local_110.x = (float)(uVar17 & (uint)(local_208.x + 2.0) | ~uVar17 & (uint)fVar20);
      local_1f8._0_4_ = local_1b8 / 6.0;
      lVar16 = 0;
      do {
        lVar1 = lVar16 + 1;
        local_148._4_4_ = (float)(int)lVar16 * (float)local_1f8._0_4_ + local_208.y;
        local_148._0_4_ = local_1c8._0_4_;
        local_e8.y = (float)(int)lVar1 * (float)local_1f8._0_4_ + local_208.y;
        local_e8.x = (float)local_158._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (this,(ImVec2 *)local_148,&local_e8,(ImU32)(&local_178.x)[lVar16],
                   (ImU32)(&local_178.x)[lVar16],(ImU32)(&local_178.y)[lVar16],
                   (ImU32)(&local_178.y)[lVar16]);
        lVar16 = lVar1;
      } while (lVar1 != 6);
      _local_1f8 = ZEXT416((uint)(float)(int)(local_228 * local_1b8 + local_208.y + 0.5));
      p_min.y = local_208.y;
      p_min.x = (float)local_1c8._0_4_;
      p_max_02.y = local_1b8 + local_208.y;
      p_max_02.x = (float)local_158._0_4_;
      RenderFrameBorder(p_min,p_max_02,0.0);
      pos.x = (float)local_1c8._0_4_ + -1.0;
      pos.y = (float)local_1f8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(this,pos,half_sz,local_138 + 2.0,(local_218->Style).Alpha);
      pIVar15 = local_1e0;
      IVar8 = local_19c;
    }
  }
  else {
    local_b8 = ZEXT416((uint)(0.5 / local_a8));
    iVar9 = 4;
    if (4 < (int)local_a8 / 0xc) {
      iVar9 = (int)local_a8 / 0xc;
    }
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -(0.5 / local_a8);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_a8 = local_a8 + (float)local_1f8._0_4_;
    local_98 = local_a8 * 0.5;
    uStack_94 = uStack_a4;
    uStack_90 = uStack_a0;
    uStack_8c = uStack_9c;
    lVar16 = 0;
    local_19c = IVar8;
    local_dc = col_upr_right;
    do {
      fVar20 = (float)(int)lVar16 / 6.0;
      fVar20 = (fVar20 + fVar20) * 3.1415927 + (float)local_88._0_4_;
      local_158._0_4_ = fVar20;
      fVar24 = ((float)(int)lVar16 + 1.0) / 6.0;
      fVar24 = (fVar24 + fVar24) * 3.1415927 + (float)local_b8._0_4_;
      local_128.x = fVar24;
      iVar13 = (this->VtxBuffer).Size;
      ImDrawList::PathArcTo(this,&local_1e8,local_98,fVar20,fVar24,iVar9);
      ImDrawList::AddPolyline
                (this,(this->_Path).Data,(this->_Path).Size,local_d8._0_4_,false,local_200);
      (this->_Path).Size = 0;
      vert_end_idx = (this->VtxBuffer).Size;
      local_1c8._0_4_ = local_1e8.x;
      fVar20 = cosf((float)local_158._0_4_);
      local_1c8._4_4_ = extraout_XMM0_Db_01;
      local_1c8._0_4_ = fVar20 * (float)local_1f8._0_4_ + (float)local_1c8._0_4_;
      uStack_1c0 = extraout_XMM0_Dc_01;
      uStack_1bc = extraout_XMM0_Dd_01;
      local_1fc = local_1e8.y;
      fVar20 = sinf((float)local_158._0_4_);
      uStack_1c0 = local_1c8._4_4_;
      local_1c8._4_4_ = fVar20 * (float)local_1f8._0_4_ + local_1fc;
      uStack_1bc = extraout_XMM0_Db_02;
      local_158 = ZEXT416((uint)local_1e8.x);
      fVar20 = cosf(local_128.x);
      local_158._0_4_ = (float)local_158._0_4_ + fVar20 * (float)local_1f8._0_4_;
      local_1fc = local_1e8.y;
      fVar20 = sinf(local_128.x);
      gradient_p1.y = fVar20 * (float)local_1f8._0_4_ + local_1fc;
      gradient_p1.x = (float)local_158._0_4_;
      lVar1 = lVar16 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (this,iVar13,vert_end_idx,(ImVec2)local_1c8,gradient_p1,
                 (ImU32)(&local_178.x)[lVar16],(ImU32)(&local_178.y)[lVar16]);
      lVar16 = lVar1;
    } while (lVar1 != 6);
    fVar20 = cosf((local_228 + local_228) * 3.1415927);
    local_1f8._0_4_ = fVar20;
    fVar20 = sinf((local_228 + local_228) * 3.1415927);
    IVar8 = local_dc;
    local_1c8._0_4_ = fVar20;
    local_148._4_4_ = local_a8 * fVar20 * 0.5 + local_1e8.y;
    local_148._0_4_ = local_a8 * (float)local_1f8._0_4_ * 0.5 + local_1e8.x;
    col_00 = local_d8._0_4_;
    if ((char)local_210 == '\0') {
      fVar20 = 0.55;
    }
    else {
      fVar20 = 0.65;
    }
    local_200 = local_200 * fVar20;
    iVar9 = 0x20;
    if ((int)(local_200 / 1.4) < 0x20) {
      iVar9 = (int)(local_200 / 1.4);
    }
    iVar13 = 9;
    if (9 < iVar9) {
      iVar13 = iVar9;
    }
    ImDrawList::AddCircleFilled(this,(ImVec2 *)local_148,local_200,local_dc,iVar13);
    ImDrawList::AddCircle(this,(ImVec2 *)local_148,local_200 + 1.0,local_198,iVar13,1.0);
    ImDrawList::AddCircle(this,(ImVec2 *)local_148,local_200,col_00,iVar13,1.0);
    local_e8.x = (local_180.x * (float)local_1f8._0_4_ - (float)local_1c8._0_4_ * local_180.y) +
                 local_1e8.x;
    local_e8.y = local_180.x * (float)local_1c8._0_4_ + local_180.y * (float)local_1f8._0_4_ +
                 local_1e8.y;
    local_38.y = local_188.x * (float)local_1c8._0_4_ + local_188.y * (float)local_1f8._0_4_ +
                 local_1e8.y;
    local_38.x = (local_188.x * (float)local_1f8._0_4_ - (float)local_1c8._0_4_ * local_188.y) +
                 local_1e8.x;
    local_40.y = local_190.x * (float)local_1c8._0_4_ + (float)local_1f8._0_4_ * local_190.y +
                 local_1e8.y;
    local_40.x = (local_190.x * (float)local_1f8._0_4_ - (float)local_1c8._0_4_ * local_190.y) +
                 local_1e8.x;
    IVar21 = GetFontTexUvWhitePixel();
    uStack_1f0 = extraout_XMM0_Qb;
    local_1f8._0_4_ = IVar21.x;
    local_1f8._4_4_ = IVar21.y;
    ImDrawList::PrimReserve(this,6,6);
    auVar6 = _local_1f8;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)this->_VtxCurrentIdx;
    this->_IdxWritePtr = pIVar3 + 1;
    this->_VtxWritePtr->pos = local_e8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar8;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = IVar8;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = col_00;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_e8;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = col_00;
    this->_VtxWritePtr = pIVar4 + 1;
    uVar17 = this->_VtxCurrentIdx + 1;
    this->_VtxCurrentIdx = uVar17;
    pIVar3 = this->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar17;
    this->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = this->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1f8._0_4_;
    (pIVar4->uv).y = (float)local_1f8._4_4_;
    pIVar4 = this->_VtxWritePtr;
    pIVar4->col = 0;
    this->_VtxWritePtr = pIVar4 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    _local_1f8 = auVar6;
    ImDrawList::AddTriangle(this,&local_e8,&local_38,&local_40,local_198,1.5);
    fVar20 = 1.0;
    if (local_220 <= 1.0) {
      fVar20 = local_220;
    }
    fVar20 = (float)(~-(uint)(local_220 < 0.0) & (uint)fVar20);
    fVar23 = (local_e8.x - local_40.x) * fVar20 + local_40.x;
    fVar24 = (local_e8.y - local_40.y) * fVar20 + local_40.y;
    fVar22 = 1.0 - local_21c;
    fVar20 = 1.0;
    if (fVar22 <= 1.0) {
      fVar20 = fVar22;
    }
    fVar20 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar20);
    local_110.x = (local_38.x - fVar23) * fVar20 + fVar23;
    local_110.y = (local_38.y - fVar24) * fVar20 + fVar24;
    pIVar15 = local_1e0;
    IVar8 = local_19c;
  }
  pIVar5 = local_218;
  if ((char)local_20c == '\0') {
    fVar20 = 6.0;
  }
  else {
    fVar20 = 10.0;
  }
  local_1f8._0_4_ = fVar20;
  ImDrawList::AddCircleFilled(this,&local_110,fVar20,IVar8,0xc);
  ImDrawList::AddCircle(this,&local_110,(float)local_1f8._0_4_ + 1.0,local_198,0xc,1.0);
  ImDrawList::AddCircle(this,&local_110,(float)local_1f8._0_4_,local_d8._0_4_,0xc,1.0);
  if (local_194 == 0x10000) {
    fVar20 = pIVar15[1].y;
    _local_1c8 = ZEXT416((uint)fVar20);
    fVar24 = 1.0;
    if (fVar20 <= 1.0) {
      fVar24 = fVar20;
    }
    _local_1f8 = ZEXT416((uint)(1.0 - fVar24));
    local_148._8_4_ = local_138 + (float)local_108._0_4_;
    fStack_13c = local_1b8 + local_208.y;
    local_148._4_4_ = local_208.y;
    local_148._0_4_ = local_108._0_4_;
    p_max.y = fStack_13c;
    p_max.x = (float)local_148._8_4_;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_148._0_8_,p_max,0,
               ((float)local_148._8_4_ - (float)local_108._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (this,(ImVec2 *)local_148,(ImVec2 *)(local_148 + 8),IVar8,IVar8,IVar8 & 0xffffff,
               IVar8 & 0xffffff);
    local_1f8._4_4_ = (float)(int)(float)(~local_1c8._4_4_ & local_1f8._4_4_);
    local_1f8._0_4_ =
         (float)(int)((float)(-(uint)((float)local_1c8._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_1c8._0_4_ < 0.0) & local_1f8._0_4_) * local_1b8 +
                      local_208.y + 0.5);
    uStack_1f0._0_4_ = (uint)(float)(int)(float)(~uStack_1c0 & (uint)uStack_1f0);
    uStack_1f0._4_4_ = (uint)(float)(int)(float)(~uStack_1bc & uStack_1f0._4_4_);
    p_max_00.y = fStack_13c;
    p_max_00.x = (float)local_148._8_4_;
    RenderFrameBorder((ImVec2)local_148._0_8_,p_max_00,0.0);
    pos_00.x = (float)local_108._0_4_ + -1.0;
    pos_00.y = (float)local_1f8._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(this,pos_00,half_sz_00,local_138 + 2.0,(pIVar5->Style).Alpha);
  }
  EndGroup();
  uVar17 = local_224;
  if ((char)local_224 != '\0') {
    iVar9 = bcmp(local_58,pIVar15,local_70);
    uVar17 = uVar17 & 0xff;
    if (iVar9 == 0) {
      uVar17 = 0;
    }
  }
  bVar12 = (byte)uVar17;
  if ((uVar17 & 1) != 0) {
    MarkItemEdited((local_f0->DC).LastItemId);
  }
  PopID();
LAB_00350902:
  return (bool)(bVar12 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0)
            H = g.ColorEditLastHue;
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            memcpy(g.ColorEditLastColor, col, sizeof(float) * 3);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            if (S == 0 && memcmp(g.ColorEditLastColor, col, sizeof(float) * 3) == 0) // Fix local Hue as display below will use it immediately.
                H = g.ColorEditLastHue;
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_white);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}